

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_randomspawner.cpp
# Opt level: O0

void __thiscall ARandomSpawner::Tick(ARandomSpawner *this)

{
  bool bVar1;
  AActor *pAVar2;
  ARandomSpawner *this_local;
  
  AActor::Tick(&this->super_AActor);
  bVar1 = TObjPtr<AActor>::operator==(&(this->super_AActor).tracer,(AActor *)0x0);
  if ((!bVar1) &&
     (pAVar2 = TObjPtr<AActor>::operator->(&(this->super_AActor).tracer), 0 < pAVar2->health)) {
    return;
  }
  A_BossDeath(&this->super_AActor);
  (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
  return;
}

Assistant:

void Tick()	// This function is needed for handling boss replacers
	{
		Super::Tick();
		if (tracer == NULL || tracer->health <= 0)
		{
			A_BossDeath(this);
			Destroy();
		}
	}